

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t COVER_checkTotalCompressedSize
                 (ZDICT_cover_params_t parameters,size_t *samplesSizes,BYTE *samples,size_t *offsets
                 ,size_t nbTrainSamples,size_t nbSamples,BYTE *dict,size_t dictBufferCapacity)

{
  ZSTD_customMem customMem;
  ulong uVar1;
  void *dst;
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  size_t sVar2;
  ulong uVar3;
  size_t __size;
  ulong uVar4;
  
  uVar4 = 0;
  if (parameters.splitPoint < 1.0) {
    uVar4 = nbTrainSamples;
  }
  __size = 0x40;
  if (uVar4 < nbSamples) {
    uVar1 = 0;
    uVar3 = uVar4;
    do {
      if (uVar1 < samplesSizes[uVar3]) {
        uVar1 = samplesSizes[uVar3];
      }
      uVar3 = uVar3 + 1;
    } while (nbSamples != uVar3);
    if (uVar1 < 0xff00ff00ff00ff00) {
      uVar3 = 0;
      if (uVar1 < 0x20000) {
        uVar3 = (ulong)(0x20000U - (int)uVar1 >> 0xb);
      }
      __size = uVar3 + (uVar1 >> 8) + uVar1;
      goto LAB_0019d81e;
    }
  }
  else {
LAB_0019d81e:
    if (__size != 0) goto LAB_0019d82a;
  }
  __size = 0xffffffffffffffb8;
LAB_0019d82a:
  dst = malloc(__size);
  customMem.customFree = (ZSTD_freeFunction)__size;
  customMem.customAlloc = (ZSTD_allocFunction)dict;
  customMem.opaque = samples;
  cctx = ZSTD_createCCtx_advanced(customMem);
  cdict = ZSTD_createCDict(dict,dictBufferCapacity,parameters.zParams.compressionLevel);
  sVar2 = 0xffffffffffffffff;
  if (cdict != (ZSTD_CDict *)0x0 && (cctx != (ZSTD_CCtx *)0x0 && dst != (void *)0x0)) {
    sVar2 = dictBufferCapacity;
  }
  if (uVar4 < nbSamples &&
      (cdict != (ZSTD_CDict *)0x0 && (cctx != (ZSTD_CCtx *)0x0 && dst != (void *)0x0))) {
    do {
      sVar2 = ZSTD_compress_usingCDict_internal
                        (cctx,dst,__size,samples + offsets[uVar4],samplesSizes[uVar4],cdict,
                         (ZSTD_frameParameters)ZEXT812(1));
      if (0xffffffffffffff88 < sVar2) break;
      sVar2 = dictBufferCapacity + sVar2;
      uVar4 = uVar4 + 1;
      dictBufferCapacity = sVar2;
    } while (nbSamples != uVar4);
  }
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  if (dst != (void *)0x0) {
    free(dst);
  }
  return sVar2;
}

Assistant:

size_t COVER_checkTotalCompressedSize(const ZDICT_cover_params_t parameters,
                                    const size_t *samplesSizes, const BYTE *samples,
                                    size_t *offsets,
                                    size_t nbTrainSamples, size_t nbSamples,
                                    BYTE *const dict, size_t dictBufferCapacity) {
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Pointers */
  ZSTD_CCtx *cctx;
  ZSTD_CDict *cdict;
  void *dst;
  /* Local variables */
  size_t dstCapacity;
  size_t i;
  /* Allocate dst with enough space to compress the maximum sized sample */
  {
    size_t maxSampleSize = 0;
    i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
    for (; i < nbSamples; ++i) {
      maxSampleSize = MAX(samplesSizes[i], maxSampleSize);
    }
    dstCapacity = ZSTD_compressBound(maxSampleSize);
    dst = malloc(dstCapacity);
  }
  /* Create the cctx and cdict */
  cctx = ZSTD_createCCtx();
  cdict = ZSTD_createCDict(dict, dictBufferCapacity,
                           parameters.zParams.compressionLevel);
  if (!dst || !cctx || !cdict) {
    goto _compressCleanup;
  }
  /* Compress each sample and sum their sizes (or error) */
  totalCompressedSize = dictBufferCapacity;
  i = parameters.splitPoint < 1.0 ? nbTrainSamples : 0;
  for (; i < nbSamples; ++i) {
    const size_t size = ZSTD_compress_usingCDict(
        cctx, dst, dstCapacity, samples + offsets[i],
        samplesSizes[i], cdict);
    if (ZSTD_isError(size)) {
      totalCompressedSize = size;
      goto _compressCleanup;
    }
    totalCompressedSize += size;
  }
_compressCleanup:
  ZSTD_freeCCtx(cctx);
  ZSTD_freeCDict(cdict);
  if (dst) {
    free(dst);
  }
  return totalCompressedSize;
}